

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlSBufCleanup(xmlSBuf *buf,xmlParserCtxtPtr ctxt,char *errMsg)

{
  xmlParserErrors code;
  
  code = buf->code;
  if (code != XML_ERR_OK) {
    if (code == XML_ERR_NO_MEMORY) {
      xmlCtxtErrMemory(ctxt);
    }
    else {
      xmlFatalErr(ctxt,code,errMsg);
    }
  }
  (*xmlFree)(buf->mem);
  return;
}

Assistant:

static void
xmlSBufCleanup(xmlSBuf *buf, xmlParserCtxtPtr ctxt, const char *errMsg) {
    if (buf->code != XML_ERR_OK)
        xmlSBufReportError(buf, ctxt, errMsg);

    xmlFree(buf->mem);
}